

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O2

void __thiscall duckdb::DuckTransaction::SetReadWrite(DuckTransaction *this)

{
  __uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> __p;
  tuple<duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_> in_RAX;
  __uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> local_18;
  
  (this->super_Transaction).is_read_only = false;
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
  super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
       (tuple<duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>)
       (tuple<duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>)
       in_RAX.
       super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
       .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl;
  StorageLock::GetSharedLock((StorageLock *)&local_18);
  __p._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
  super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
       local_18._M_t.
       super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
       .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl;
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
  super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
       (tuple<duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>)
       (_Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>)0x0
  ;
  ::std::__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  reset((__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
        &this->write_lock,
        (pointer)__p._M_t.
                 super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
                 .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  ~unique_ptr((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
              &local_18);
  return;
}

Assistant:

void DuckTransaction::SetReadWrite() {
	Transaction::SetReadWrite();
	// obtain a shared checkpoint lock to prevent concurrent checkpoints while this transaction is running
	write_lock = transaction_manager.SharedCheckpointLock();
}